

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O3

double atand(double v)

{
  double dVar1;
  
  if ((v == -1.0) && (!NAN(v))) {
    return -45.0;
  }
  if ((v == 0.0) && (!NAN(v))) {
    return 0.0;
  }
  if ((v == 1.0) && (!NAN(v))) {
    return 45.0;
  }
  dVar1 = atan(v);
  return dVar1 * 57.29577951308232;
}

Assistant:

double atand(double v) {
    if (v == -1.0) {
        return -45.0;
    } else if (v == 0.0) {
        return 0.0;
    } else if (v == 1.0) {
        return 45.0;
    }

    return atan(v) * R2D;
}